

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_count(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
               lys_module *UNUSED_local_mod,lyxp_set *set,int UNUSED_options)

{
  char *pcVar1;
  int UNUSED_options_local;
  lyxp_set *set_local;
  lys_module *UNUSED_local_mod_local;
  lyd_node *UNUSED_cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  if ((*args)->type == LYXP_SET_EMPTY) {
    set_fill_number(set,(longdouble)0);
    args_local._4_4_ = 0;
  }
  else if ((*args)->type == LYXP_SET_NODE_SET) {
    set_fill_number(set,(longdouble)(*args)->used);
    args_local._4_4_ = 0;
  }
  else {
    pcVar1 = print_set_type(*args);
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar1,"count(node-set)");
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_count(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
            struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int UNUSED(options))
{
    if (args[0]->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "count(node-set)");
        return -1;
    }

    set_fill_number(set, args[0]->used);
    return EXIT_SUCCESS;
}